

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_EQ_RANGE_Vector_Test::iu_AssertionTest_x_iutest_x_EQ_RANGE_Vector_Test
          (iu_AssertionTest_x_iutest_x_EQ_RANGE_Vector_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0018a408;
  return;
}

Assistant:

IUTEST(AssertionTest, EQ_RANGE_Vector)
{
    int  d[] = { 0, 1, 2, 3, 4 };
    const int COUNT=sizeof(d)/sizeof(d[0]);
    ::std::vector<int> a, b;
    ::std::vector<char> c;
    for( int i=0; i < COUNT; ++i )
    {
        a.push_back(i);
        b.push_back(i);
        c.push_back(static_cast<char>(i));
    }
    IUTEST_ASSERT_EQ_RANGE(a, b);
    IUTEST_EXPECT_EQ_RANGE(a, b);
    IUTEST_INFORM_EQ_RANGE(a, b);
    IUTEST_ASSUME_EQ_RANGE(a, b);

    IUTEST_ASSERT_EQ_RANGE(a, c);
    IUTEST_EXPECT_EQ_RANGE(a, c);
    IUTEST_INFORM_EQ_RANGE(a, c);
    IUTEST_ASSUME_EQ_RANGE(a, c);

    IUTEST_ASSERT_EQ_RANGE(a, d);
    IUTEST_EXPECT_EQ_RANGE(a, d);
    IUTEST_INFORM_EQ_RANGE(a, d);
    IUTEST_ASSUME_EQ_RANGE(a, d);

    IUTEST_ASSERT_EQ_RANGE(d, c);
    IUTEST_EXPECT_EQ_RANGE(d, c);
    IUTEST_INFORM_EQ_RANGE(d, c);
    IUTEST_ASSUME_EQ_RANGE(d, c);
}